

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_shared_qualifier
               (NegativeTestContext *ctx)

{
  SsboArgData *pSVar1;
  ulong uVar2;
  bool bVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  GLuint program_00;
  RenderContext *pRVar4;
  SsboArgs *args;
  char *__s;
  MessageBuilder *pMVar5;
  size_type sVar6;
  reference pvVar7;
  TestLog *in_R8;
  TestLog *log_00;
  SsboArgData *local_c28;
  SsboArgData *local_c10;
  allocator<char> local_ab9;
  string local_ab8;
  MessageBuilder local_a98;
  string local_918;
  SsboArgData local_8f8;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_8d0;
  allocator<char> local_8b1;
  string local_8b0;
  GLchar *local_890;
  char *shaderFragmentCharPtr;
  string shaderFragmentString;
  GLint shaderFragmentGL;
  GLint program;
  GLint linkStatus;
  size_t idx;
  string local_6d0;
  undefined4 local_6ac;
  MessageBuilder local_6a8;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  local_528;
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  local_509;
  undefined1 local_508 [8];
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  string local_4e8;
  ArgMember local_4c8;
  allocator<char> local_4c1;
  string local_4c0;
  ArgMember local_4a0;
  allocator<char> local_499;
  string local_498;
  ArgMember local_474;
  SsboArgData *local_470;
  undefined1 local_468 [8];
  SsboArgData argDataArrayFrag [3];
  undefined1 local_3e0 [8];
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorVert;
  string local_3c0;
  ArgMember local_3a0;
  allocator<char> local_399;
  string local_398;
  ArgMember local_378;
  allocator<char> local_371;
  string local_370;
  ArgMember local_350;
  allocator<char> local_349;
  string local_348;
  ArgMember local_328;
  allocator<char> local_321;
  string local_320;
  ArgMember local_300;
  allocator<char> local_2f9;
  string local_2f8;
  ArgMember local_2d4;
  SsboArgData *local_2d0;
  undefined1 local_2c8 [8];
  SsboArgData argDataArrayVert [6];
  char *shaderVertexCharPtr;
  string shaderVertexString;
  GLint shaderVertexGL;
  bool result;
  undefined1 local_188 [8];
  SsboArgs ssboArgs;
  string local_68 [8];
  string versionString;
  string message;
  TestLog *log;
  GLSLVersion version;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar4 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(ctxType,requiredApiType);
  args = (SsboArgs *)glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  std::__cxx11::string::string((string *)(versionString.field_2._M_local_buf + 8));
  __s = glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,__s,(allocator<char> *)((long)&ssboArgs.m_testLog + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&ssboArgs.m_testLog + 3));
  std::__cxx11::string::string((string *)&shaderVertexGL,local_68);
  anon_unknown_0::args::SsboArgs::SsboArgs
            ((SsboArgs *)local_188,(string *)&shaderVertexGL,(TestLog *)args);
  std::__cxx11::string::~string((string *)&shaderVertexGL);
  std::__cxx11::string::string((string *)&shaderVertexCharPtr);
  argDataVectorVert.
  super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_2d0 = (SsboArgData *)local_2c8;
  local_2d4 = ARGMEMBER_FORMAT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"shared",&local_2f9);
  anon_unknown_0::args::SsboArgData::SsboArgData((SsboArgData *)local_2c8,&local_2d4,&local_2f8);
  pSVar1 = (SsboArgData *)((long)&argDataArrayVert[0].data.field_2 + 8);
  local_300 = ARGMEMBER_BINDING_POINT;
  local_2d0 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"0",&local_321);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_300,&local_320);
  pSVar1 = (SsboArgData *)((long)&argDataArrayVert[1].data.field_2 + 8);
  local_328 = ARGMEMBER_MATRIX_ORDER;
  local_2d0 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"column_major",&local_349)
  ;
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_328,&local_348);
  pSVar1 = (SsboArgData *)((long)&argDataArrayVert[2].data.field_2 + 8);
  local_350 = ARGMEMBER_FIXED_ARRAY;
  local_2d0 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"10",&local_371);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_350,&local_370);
  pSVar1 = (SsboArgData *)((long)&argDataArrayVert[3].data.field_2 + 8);
  local_378 = ARGMEMBER_VARIABLE_ARRAY;
  local_2d0 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"10",&local_399);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_378,&local_398);
  pSVar1 = (SsboArgData *)((long)&argDataArrayVert[4].data.field_2 + 8);
  local_3a0 = ARGMEMBER_REORDER;
  local_2d0 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"false",
             (allocator<char> *)
             ((long)&argDataVectorVert.
                     super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_3a0,&local_3c0);
  argDataVectorVert.
  super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&argDataVectorVert.
                     super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  ::allocator((allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
               *)&stack0xfffffffffffffc1f);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)local_3e0,(SsboArgData *)local_2c8,
             (SsboArgData *)((long)&argDataArrayVert[5].data.field_2 + 8),
             (allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
              *)&stack0xfffffffffffffc1f);
  std::
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  ::~allocator((allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
                *)&stack0xfffffffffffffc1f);
  argDataVectorFrag.
  super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_470 = (SsboArgData *)local_468;
  local_474 = ARGMEMBER_MATRIX_ORDER;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"row_major",&local_499);
  anon_unknown_0::args::SsboArgData::SsboArgData((SsboArgData *)local_468,&local_474,&local_498);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[0].data.field_2 + 8);
  local_4a0 = ARGMEMBER_VARIABLE_ARRAY;
  local_470 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"",&local_4c1);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_4a0,&local_4c0);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[1].data.field_2 + 8);
  local_4c8 = ARGMEMBER_FIXED_ARRAY;
  local_470 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"20",
             (allocator<char> *)
             ((long)&argDataVectorFrag.
                     super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_4c8,&local_4e8);
  argDataVectorFrag.
  super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&argDataVectorFrag.
                     super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  ::allocator(&local_509);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)local_508,(SsboArgData *)local_468,
             (SsboArgData *)((long)&argDataArrayFrag[2].data.field_2 + 8),&local_509);
  std::
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  ::~allocator(&local_509);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::vector(&local_528,
           (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
            *)local_3e0);
  shaderVertexString.field_2._M_local_buf[0xf] =
       anon_unknown_0::args::SsboArgs::setAllValues((SsboArgs *)local_188,&local_528);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&local_528);
  if ((shaderVertexString.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::operator=
              ((string *)(versionString.field_2._M_local_buf + 8),
               "Invalid use of args.setAllValues()");
    tcu::TestLog::operator<<(&local_6a8,(TestLog *)args,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_6a8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&versionString.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6a8);
    local_6ac = 1;
  }
  else {
    NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
              (&local_6d0,(_anonymous_namespace_ *)0x8b31,(GLenum)local_188,args,in_R8);
    std::__cxx11::string::operator=((string *)&shaderVertexCharPtr,(string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6d0);
    argDataArrayVert[5].data.field_2._8_8_ = std::__cxx11::string::c_str();
    shaderVertexString.field_2._8_4_ =
         glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
    std::__cxx11::string::operator=
              ((string *)(versionString.field_2._M_local_buf + 8),(string *)&shaderVertexCharPtr);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&idx,(TestLog *)args,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&idx,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&versionString.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&idx);
    log_00 = (TestLog *)0x0;
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,shaderVertexString.field_2._8_4_,1,
               (GLchar **)((long)&argDataArrayVert[5].data.field_2 + 8),(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&ctx->super_CallLogWrapper,shaderVertexString.field_2._8_4_);
    _program = 0;
    while( true ) {
      uVar2 = _program;
      sVar6 = std::
              vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
              ::size((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                      *)local_508);
      if (sVar6 <= uVar2) break;
      shaderFragmentGL = -1;
      std::__cxx11::string::string((string *)&shaderFragmentCharPtr);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b0,
                 "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
                 ,&local_8b1);
      NegativeTestContext::beginSection(ctx,&local_8b0);
      std::__cxx11::string::~string((string *)&local_8b0);
      std::allocator<char>::~allocator(&local_8b1);
      program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
      std::
      vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
      ::vector(&local_8d0,
               (vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                *)local_3e0);
      anon_unknown_0::args::SsboArgs::setAllValues((SsboArgs *)local_188,&local_8d0);
      std::
      vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
      ::~vector(&local_8d0);
      pvVar7 = std::
               vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
               ::operator[]((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                             *)local_508,_program);
      anon_unknown_0::args::SsboArgData::SsboArgData(&local_8f8,pvVar7);
      anon_unknown_0::args::SsboArgs::setSingleValue((SsboArgs *)local_188,&local_8f8);
      anon_unknown_0::args::SsboArgData::~SsboArgData(&local_8f8);
      NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
                (&local_918,(_anonymous_namespace_ *)0x8b30,(GLenum)local_188,args,log_00);
      std::__cxx11::string::operator=((string *)&shaderFragmentCharPtr,(string *)&local_918);
      std::__cxx11::string::~string((string *)&local_918);
      local_890 = (GLchar *)std::__cxx11::string::c_str();
      shaderFragmentString.field_2._12_4_ =
           glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
      std::__cxx11::string::operator=
                ((string *)(versionString.field_2._M_local_buf + 8),(string *)&shaderFragmentCharPtr
                );
      tcu::TestLog::operator<<
                (&local_a98,(TestLog *)args,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_a98,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&versionString.field_2 + 8));
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a98);
      log_00 = (TestLog *)0x0;
      glu::CallLogWrapper::glShaderSource
                (&ctx->super_CallLogWrapper,shaderFragmentString.field_2._12_4_,1,&local_890,
                 (GLint *)0x0);
      glu::CallLogWrapper::glCompileShader
                (&ctx->super_CallLogWrapper,shaderFragmentString.field_2._12_4_);
      glu::CallLogWrapper::glAttachShader
                (&ctx->super_CallLogWrapper,program_00,shaderVertexString.field_2._8_4_);
      glu::CallLogWrapper::glAttachShader
                (&ctx->super_CallLogWrapper,program_00,shaderFragmentString.field_2._12_4_);
      glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program_00);
      glu::CallLogWrapper::glGetProgramiv
                (&ctx->super_CallLogWrapper,program_00,0x8b82,&shaderFragmentGL);
      logProgramInfo(ctx,program_00);
      if (shaderFragmentGL == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab8,"Program should not have linked",&local_ab9);
        NegativeTestContext::fail(ctx,&local_ab8);
        std::__cxx11::string::~string((string *)&local_ab8);
        std::allocator<char>::~allocator(&local_ab9);
      }
      glu::CallLogWrapper::glDeleteShader
                (&ctx->super_CallLogWrapper,shaderFragmentString.field_2._12_4_);
      glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
      NegativeTestContext::endSection(ctx);
      std::__cxx11::string::~string((string *)&shaderFragmentCharPtr);
      _program = _program + 1;
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shaderVertexString.field_2._8_4_)
    ;
    local_6ac = 0;
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)local_508);
  local_c10 = (SsboArgData *)((long)&argDataArrayFrag[2].data.field_2 + 8);
  do {
    local_c10 = local_c10 + -1;
    anon_unknown_0::args::SsboArgData::~SsboArgData(local_c10);
  } while (local_c10 != (SsboArgData *)local_468);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)local_3e0);
  local_c28 = (SsboArgData *)((long)&argDataArrayVert[5].data.field_2 + 8);
  do {
    local_c28 = local_c28 + -1;
    anon_unknown_0::args::SsboArgData::~SsboArgData(local_c28);
  } while (local_c28 != (SsboArgData *)local_2c8);
  std::__cxx11::string::~string((string *)&shaderVertexCharPtr);
  anon_unknown_0::args::SsboArgs::~SsboArgs((SsboArgs *)local_188);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(versionString.field_2._M_local_buf + 8));
  return;
}

Assistant:

void ssbo_block_shared_qualifier(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	bool					result;
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// default args used in vertex shader ssbo
	const args::SsboArgData argDataArrayVert[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"shared"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"0"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"column_major"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"10"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"10"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"false") };
	std::vector<args::SsboArgData> argDataVectorVert(argDataArrayVert, argDataArrayVert + sizeof(argDataArrayVert) / sizeof(argDataArrayVert[0]));

	// args changed in fragment shader ssbo
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	""),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// set default vertex ssbo args
	result = ssboArgs.setAllValues(argDataVectorVert);

	if (result == false)
	{
		message = "Invalid use of args.setAllValues()";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); idx++)
	{
		GLint		linkStatus				=	-1;
		GLint		program;
		GLint		shaderFragmentGL;
		std::string	shaderFragmentString;
		const char*	shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.setAllValues(argDataVectorVert);
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to the program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}